

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_Size_Test<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Size_Test<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  char *lhs_expression;
  HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *this_00;
  uint *lhs;
  long in_RDI;
  AssertionResult gtest_ar_4;
  int i_1;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  int i;
  AssertionResult gtest_ar;
  key_type *in_stack_fffffffffffffe38;
  HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffe40;
  unsigned_long *in_stack_fffffffffffffe48;
  char *in_stack_fffffffffffffe50;
  char *in_stack_fffffffffffffe58;
  int line;
  char *in_stack_fffffffffffffe60;
  char *in_stack_fffffffffffffe68;
  AssertHelper *in_stack_fffffffffffffe70;
  AssertionResult local_158;
  undefined4 in_stack_fffffffffffffeb8;
  key_type in_stack_fffffffffffffebc;
  BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffec0;
  int local_114;
  AssertionResult local_f0;
  key_type local_dc;
  size_type local_c8;
  undefined4 local_bc;
  AssertionResult local_b8 [2];
  size_type local_98;
  long local_90;
  AssertionResult local_88 [3];
  value_type local_50;
  int local_4c;
  size_type local_28;
  undefined4 local_1c;
  AssertionResult local_18;
  
  local_1c = 0;
  local_28 = google::
             BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::size((BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                     *)0xc30150);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,(uint *)in_stack_fffffffffffffe48,
             (unsigned_long *)in_stack_fffffffffffffe40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe70);
    testing::AssertionResult::failure_message((AssertionResult *)0xc301b7);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffe70,(Type)((ulong)in_stack_fffffffffffffe68 >> 0x20),
               in_stack_fffffffffffffe60,(int)((ulong)in_stack_fffffffffffffe58 >> 0x20),
               in_stack_fffffffffffffe50);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffec0,
               (Message *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe40);
    testing::Message::~Message((Message *)0xc30214);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc30285);
  for (local_4c = 1; local_4c < 1000; local_4c = local_4c + 1) {
    in_stack_fffffffffffffe70 = (AssertHelper *)(in_RDI + 0x10);
    local_50 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueObject(in_stack_fffffffffffffe40,
                              (int)((ulong)in_stack_fffffffffffffe38 >> 0x20));
    google::
    BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffffec0,
             (value_type *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    local_90 = (long)local_4c;
    local_98 = google::
               BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::size((BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)0xc302fd);
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
               (unsigned_long *)in_stack_fffffffffffffe40);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_88);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffe70);
      in_stack_fffffffffffffe68 =
           testing::AssertionResult::failure_message((AssertionResult *)0xc30376);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffe70,(Type)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                 in_stack_fffffffffffffe60,(int)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                 in_stack_fffffffffffffe50);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_fffffffffffffec0,
                 (Message *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe40);
      testing::Message::~Message((Message *)0xc303d3);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xc3043e);
  }
  google::
  BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::clear((BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *)0xc30474);
  local_bc = 0;
  local_c8 = google::
             BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::size((BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                     *)0xc3048d);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,(uint *)in_stack_fffffffffffffe48,
             (unsigned_long *)in_stack_fffffffffffffe40);
  line = (int)((ulong)in_stack_fffffffffffffe58 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_b8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe70);
    in_stack_fffffffffffffe60 =
         testing::AssertionResult::failure_message((AssertionResult *)0xc304f4);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffe70,(Type)((ulong)in_stack_fffffffffffffe68 >> 0x20),
               in_stack_fffffffffffffe60,line,in_stack_fffffffffffffe50);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffec0,
               (Message *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe40);
    testing::Message::~Message((Message *)0xc30551);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc305c2);
  lhs_expression = (char *)(in_RDI + 0x10);
  local_dc = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey(in_stack_fffffffffffffe40,(int)((ulong)in_stack_fffffffffffffe38 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                     *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  google::
  BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::size((BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)0xc3060f);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (lhs_expression,in_stack_fffffffffffffe50,(uint *)in_stack_fffffffffffffe48,
             (unsigned_long *)in_stack_fffffffffffffe40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe70);
    in_stack_fffffffffffffe50 =
         testing::AssertionResult::failure_message((AssertionResult *)0xc30688);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffe70,(Type)((ulong)in_stack_fffffffffffffe68 >> 0x20),
               in_stack_fffffffffffffe60,(int)((ulong)lhs_expression >> 0x20),
               in_stack_fffffffffffffe50);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffec0,
               (Message *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe40);
    testing::Message::~Message((Message *)0xc306e5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc30756);
  for (local_114 = 2; local_114 < 1000; local_114 = local_114 + 1) {
    this_00 = (HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               *)(in_RDI + 0x10);
    HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueObject(this_00,(int)((ulong)in_stack_fffffffffffffe38 >> 0x20));
    google::
    BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffffec0,
             (value_type *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    lhs = (uint *)(in_RDI + 0x10);
    in_stack_fffffffffffffebc =
         HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ::UniqueKey(this_00,(int)((ulong)in_stack_fffffffffffffe38 >> 0x20));
    google::
    BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase((BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             *)this_00,in_stack_fffffffffffffe38);
    google::
    BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::size((BaseHashtableInterface<google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)0xc307fc);
    testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
              (lhs_expression,in_stack_fffffffffffffe50,lhs,(unsigned_long *)this_00);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_158);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffe70);
      in_stack_fffffffffffffe38 =
           (key_type *)testing::AssertionResult::failure_message((AssertionResult *)0xc30860);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffe70,(Type)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                 in_stack_fffffffffffffe60,(int)((ulong)lhs_expression >> 0x20),
                 in_stack_fffffffffffffe50);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_fffffffffffffec0,
                 (Message *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
      testing::Message::~Message((Message *)0xc308ac);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xc3090e);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Size) {
  EXPECT_EQ(0u, this->ht_.size());
  for (int i = 1; i < 1000; i++) {  // go through some resizes
    this->ht_.insert(this->UniqueObject(i));
    EXPECT_EQ(static_cast<typename TypeParam::size_type>(i), this->ht_.size());
  }
  this->ht_.clear();
  EXPECT_EQ(0u, this->ht_.size());

  this->ht_.set_deleted_key(this->UniqueKey(1));
  EXPECT_EQ(0u, this->ht_.size());  // deleted key doesn't count
  for (int i = 2; i < 1000; i++) {  // go through some resizes
    this->ht_.insert(this->UniqueObject(i));
    this->ht_.erase(this->UniqueKey(i));
    EXPECT_EQ(0u, this->ht_.size());
  }
}